

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dasm_x86.h
# Opt level: O1

void dasm_init(BuildCtx *ctx,int maxsection)

{
  ulong uVar1;
  long lVar2;
  dasm_State *pdVar3;
  dasm_Section *pdVar4;
  ulong __size;
  
  ctx->D = (dasm_State *)0x0;
  lVar2 = (long)(maxsection + -1) * 0x28;
  if (lVar2 == -0x78) {
    __size = 0;
  }
  else {
    uVar1 = 0x10;
    do {
      __size = uVar1;
      uVar1 = __size * 2;
    } while (__size < lVar2 + 0x78U);
    pdVar3 = (dasm_State *)malloc(__size);
    ctx->D = pdVar3;
    if (pdVar3 == (dasm_State *)0x0) {
      exit(1);
    }
  }
  pdVar3 = ctx->D;
  pdVar3->psize = __size;
  pdVar3->lglabels = (int *)0x0;
  pdVar3->lgsize = 0;
  pdVar3->pclabels = (int *)0x0;
  pdVar3->pcsize = 0;
  pdVar3->globals = (void **)0x0;
  pdVar3->maxsection = maxsection;
  if (0 < maxsection) {
    pdVar4 = pdVar3->sections;
    lVar2 = 0;
    do {
      pdVar4->buf = (int *)0x0;
      pdVar4->bsize = 0;
      pdVar4->rbuf = (int *)((long)(int)lVar2 * -4);
      pdVar4->epos = 0;
      lVar2 = lVar2 + 0x1000000;
      pdVar4 = pdVar4 + 1;
    } while ((ulong)(uint)maxsection << 0x18 != lVar2);
  }
  return;
}

Assistant:

void dasm_init(Dst_DECL, int maxsection)
{
  dasm_State *D;
  size_t psz = 0;
  int i;
  Dst_REF = NULL;
  DASM_M_GROW(Dst, struct dasm_State, Dst_REF, psz, DASM_PSZ(maxsection));
  D = Dst_REF;
  D->psize = psz;
  D->lglabels = NULL;
  D->lgsize = 0;
  D->pclabels = NULL;
  D->pcsize = 0;
  D->globals = NULL;
  D->maxsection = maxsection;
  for (i = 0; i < maxsection; i++) {
    D->sections[i].buf = NULL;  /* Need this for pass3. */
    D->sections[i].rbuf = D->sections[i].buf - DASM_SEC2POS(i);
    D->sections[i].bsize = 0;
    D->sections[i].epos = 0;  /* Wrong, but is recalculated after resize. */
  }
}